

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas_axpym_impl.hpp
# Opt level: O0

void HAXX::HBLAS_AXPYM<double,HAXX::quaternion<double>,HAXX::quaternion<double>>
               (char SIDE,char TRANSA,int32_t M,int32_t N,quaternion<double> ALPHA,
               quaternion<double> *A,int32_t LDA,int32_t INCA,quaternion<double> *B,int32_t LDB,
               int32_t INCB)

{
  quaternion<double> ALPHA_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int in_ECX;
  int in_EDX;
  char in_SIL;
  int32_t in_stack_00000024;
  quaternion<double> *in_stack_00000028;
  int32_t in_stack_00000034;
  undefined4 in_stack_00000038;
  undefined4 in_stack_0000003c;
  int32_t in_stack_00000040;
  char in_stack_00000047;
  quaternion<double> *locB;
  quaternion<double> *locA;
  int32_t j;
  quaternion<double> *in_stack_ffffffffffffff58;
  quaternion<double> *p;
  int local_64;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  quaternion<double> local_40;
  int local_c;
  char local_2;
  
  p = (quaternion<double> *)&stack0x00000008;
  if ((0 < in_ECX) && (0 < in_EDX)) {
    local_48 = 0.0;
    local_50 = 0.0;
    local_58 = 0.0;
    local_60 = 0.0;
    local_c = in_ECX;
    local_2 = in_SIL;
    quaternion<double>::quaternion(&local_40,&local_48,&local_50,&local_58,&local_60);
    bVar4 = operator==(p,in_stack_ffffffffffffff58);
    if (!bVar4) {
      if (local_2 != 'N') {
        __assert_fail("TRANSA == \'N\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/include/hblas/generic/hblas1/hblas_axpym_impl.hpp"
                      ,0x1e,
                      "void HAXX::HBLAS_AXPYM(const char, const char, const int32_t, const int32_t, const _AlphaF, _XF *const, const int32_t, const int32_t, quaternion<_F> *const, const int32_t, const int32_t) [_F = double, _XF = HAXX::quaternion<double>, _AlphaF = HAXX::quaternion<double>]"
                     );
      }
      for (local_64 = 0; local_64 < local_c; local_64 = local_64 + 1) {
        uVar1 = p->_M_imag_i;
        uVar2 = p->_M_imag_j;
        uVar3 = p->_M_imag_k;
        ALPHA_00._M_imag_j = (double)uVar3;
        ALPHA_00._M_imag_i = (double)uVar2;
        ALPHA_00._M_real = (double)uVar1;
        ALPHA_00._M_imag_k = (double)in_stack_ffffffffffffff58;
        HBLAS_AXPYV<double,HAXX::quaternion<double>,HAXX::quaternion<double>>
                  (in_stack_00000047,in_stack_00000040,ALPHA_00,
                   (quaternion<double> *)CONCAT44(in_stack_0000003c,in_stack_00000038),
                   in_stack_00000034,in_stack_00000028,in_stack_00000024);
      }
    }
  }
  return;
}

Assistant:

void HBLAS_AXPYM(const char SIDE, const char TRANSA, const HAXX_INT M, 
  const HAXX_INT N, const _AlphaF ALPHA, _XF * const A, const HAXX_INT LDA, 
  const HAXX_INT INCA, quaternion<_F> * const B, const HAXX_INT LDB, 
  const HAXX_INT INCB) {

  
  if( N <= 0 or M <= 0) return;
  if( ALPHA == _AlphaF(0.) ) return;

  assert(TRANSA == 'N'); // Only supporting scaling for now

  HAXX_INT j;
  
  quaternion<_F> *locA = A, *locB = B;

  for( j = 0; j < N; j++ ) {
    HBLAS_AXPYV(SIDE,M,ALPHA,locA,INCA,locB,INCB);
    locA += LDA;
    locB += LDB;
  }

}